

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_format_monetary_values::test_method(rpc_format_monetary_values *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator pvVar2;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  check_type cVar3;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  assertion_result local_108;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  undefined1 local_b8 [96];
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_40._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xe5;
  file.m_begin = (iterator)&local_e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  ValueFromAmount((UniValue *)(local_b8 + 8),0);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x476280;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"0.00000000");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(0LL).write() == \"0.00000000\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_120 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_b8._0_8_ = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_128,0xe5);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0xe6;
  file_00.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  ValueFromAmount((UniValue *)(local_b8 + 8),1);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x476392;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"0.00000001");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(1LL).write() == \"0.00000001\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_150 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_b8._0_8_ = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_158,0xe6);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0xe7;
  file_01.m_begin = (iterator)&local_168;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
             msg_01);
  ValueFromAmount((UniValue *)(local_b8 + 8),0x10ce4b3);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x47649f;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"0.17622195");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(17622195LL).write() == \"0.17622195\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_180 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_b8._0_8_ = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_188,0xe7);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0xe8;
  file_02.m_begin = (iterator)&local_198;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  ValueFromAmount((UniValue *)(local_b8 + 8),50000000);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x4765ac;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"0.50000000");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(50000000LL).write() == \"0.50000000\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1b0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_b8._0_8_ = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_1b8,0xe8);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0xe9;
  file_03.m_begin = (iterator)&local_1c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8,
             msg_03);
  ValueFromAmount((UniValue *)(local_b8 + 8),0x55bbfed);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x4766b9;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"0.89898989");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(89898989LL).write() == \"0.89898989\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1e0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_b8._0_8_ = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_1e8,0xe9);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  file_04.m_end = (iterator)0xea;
  file_04.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_208,
             msg_04);
  ValueFromAmount((UniValue *)(local_b8 + 8),100000000);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x4767c6;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"1.00000000");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(100000000LL).write() == \"1.00000000\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_210 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_b8._0_8_ = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_218,0xea);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  file_05.m_end = (iterator)0xeb;
  file_05.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_238,
             msg_05);
  ValueFromAmount((UniValue *)(local_b8 + 8),0x775f05a073ff6);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x4768de;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"20999999.99999990");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(2099999999999990LL).write() == \"20999999.99999990\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8._0_8_ = &local_118;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_240 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_248,0xeb);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  file_06.m_end = (iterator)0xec;
  file_06.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_268,
             msg_06);
  ValueFromAmount((UniValue *)(local_b8 + 8),2099999999999999);
  UniValue::write_abi_cxx11_((UniValue *)local_58,(int)(UniValue *)(local_b8 + 8),(void *)0x0,0);
  _cVar3 = 0x4769f5;
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"20999999.99999999");
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "ValueFromAmount(2099999999999999LL).write() == \"20999999.99999999\"";
  local_110 = "";
  local_d0[8] = false;
  local_d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8._0_8_ = &local_118;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_270 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar3,(size_t)&local_278,0xec);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::__cxx11::string::~string((string *)local_58);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  file_07.m_end = (iterator)0xee;
  file_07.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_298,
             msg_07);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2a0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),0);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_2a8,0xee,1,2,pvVar1,"ValueFromAmount(0).write()","0.00000000",
             "\"0.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar1;
  msg_08.m_begin = pvVar2;
  file_08.m_end = (iterator)0xef;
  file_08.m_begin = (iterator)&local_2b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c8,
             msg_08);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),0x11f71fb0450);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (local_58,&local_2d8,0xef,1,2,pvVar1,"ValueFromAmount((COIN/10000)*123456789).write()",
             "12345.67890000","\"12345.67890000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar1;
  msg_09.m_begin = pvVar2;
  file_09.m_end = (iterator)0xf0;
  file_09.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2f8,
             msg_09);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_300 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),-100000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (local_58,&local_308,0xf0,1,2,pvVar1,"ValueFromAmount(-COIN).write()","-1.00000000",
             "\"-1.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar1;
  msg_10.m_begin = pvVar2;
  file_10.m_end = (iterator)0xf1;
  file_10.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_328,
             msg_10);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),-10000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (local_58,&local_338,0xf1,1,2,pvVar1,"ValueFromAmount(-COIN/10).write()","-0.10000000",
             "\"-0.10000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar1;
  msg_11.m_begin = pvVar2;
  file_11.m_end = (iterator)0xf3;
  file_11.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_358,
             msg_11);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_360 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),10000000000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
            (local_58,&local_368,0xf3,1,2,pvVar1,"ValueFromAmount(COIN*100000000).write()",
             "100000000.00000000","\"100000000.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar1;
  msg_12.m_begin = pvVar2;
  file_12.m_end = (iterator)0xf4;
  file_12.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_388,
             msg_12);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_390 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),1000000000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[18]>
            (local_58,&local_398,0xf4,1,2,pvVar1,"ValueFromAmount(COIN*10000000).write()",
             "10000000.00000000","\"10000000.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar1;
  msg_13.m_begin = pvVar2;
  file_13.m_end = (iterator)0xf5;
  file_13.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3b8,
             msg_13);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3c0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),100000000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[17]>
            (local_58,&local_3c8,0xf5,1,2,pvVar1,"ValueFromAmount(COIN*1000000).write()",
             "1000000.00000000","\"1000000.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar1;
  msg_14.m_begin = pvVar2;
  file_14.m_end = (iterator)0xf6;
  file_14.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3e8,
             msg_14);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3f0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),10000000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
            (local_58,&local_3f8,0xf6,1,2,pvVar1,"ValueFromAmount(COIN*100000).write()",
             "100000.00000000","\"100000.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar1;
  msg_15.m_begin = pvVar2;
  file_15.m_end = (iterator)0xf7;
  file_15.m_begin = (iterator)&local_408;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_418,
             msg_15);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_420 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),1000000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (local_58,&local_428,0xf7,1,2,pvVar1,"ValueFromAmount(COIN*10000).write()",
             "10000.00000000","\"10000.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar1;
  msg_16.m_begin = pvVar2;
  file_16.m_end = (iterator)0xf8;
  file_16.m_begin = (iterator)&local_438;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_448,
             msg_16);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_450 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),100000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
            (local_58,&local_458,0xf8,1,2,pvVar1,"ValueFromAmount(COIN*1000).write()",
             "1000.00000000","\"1000.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar1;
  msg_17.m_begin = pvVar2;
  file_17.m_end = (iterator)0xf9;
  file_17.m_begin = (iterator)&local_468;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_478,
             msg_17);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_480 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),10000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (local_58,&local_488,0xf9,1,2,pvVar1,"ValueFromAmount(COIN*100).write()","100.00000000",
             "\"100.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar1;
  msg_18.m_begin = pvVar2;
  file_18.m_end = (iterator)0xfa;
  file_18.m_begin = (iterator)&local_498;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4a8,
             msg_18);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4b0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),1000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (local_58,&local_4b8,0xfa,1,2,pvVar1,"ValueFromAmount(COIN*10).write()","10.00000000",
             "\"10.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar1;
  msg_19.m_begin = pvVar2;
  file_19.m_end = (iterator)0xfb;
  file_19.m_begin = (iterator)&local_4c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4d8,
             msg_19);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4e0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),100000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_4e8,0xfb,1,2,pvVar1,"ValueFromAmount(COIN).write()","1.00000000",
             "\"1.00000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar1;
  msg_20.m_begin = pvVar2;
  file_20.m_end = (iterator)0xfc;
  file_20.m_begin = (iterator)&local_4f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_508,
             msg_20);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_510 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),10000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_518,0xfc,1,2,pvVar1,"ValueFromAmount(COIN/10).write()","0.10000000",
             "\"0.10000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar1;
  msg_21.m_begin = pvVar2;
  file_21.m_end = (iterator)0xfd;
  file_21.m_begin = (iterator)&local_528;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_538,
             msg_21);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_540 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),1000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_548,0xfd,1,2,pvVar1,"ValueFromAmount(COIN/100).write()","0.01000000",
             "\"0.01000000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar1;
  msg_22.m_begin = pvVar2;
  file_22.m_end = (iterator)0xfe;
  file_22.m_begin = (iterator)&local_558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_568,
             msg_22);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_570 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),100000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_578,0xfe,1,2,pvVar1,"ValueFromAmount(COIN/1000).write()","0.00100000",
             "\"0.00100000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar1;
  msg_23.m_begin = pvVar2;
  file_23.m_end = (iterator)0xff;
  file_23.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_598,
             msg_23);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5a0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),10000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_5a8,0xff,1,2,pvVar1,"ValueFromAmount(COIN/10000).write()","0.00010000",
             "\"0.00010000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar1;
  msg_24.m_begin = pvVar2;
  file_24.m_end = (iterator)0x100;
  file_24.m_begin = (iterator)&local_5b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5c8,
             msg_24);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5d0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),1000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_5d8,0x100,1,2,pvVar1,"ValueFromAmount(COIN/100000).write()",
             "0.00001000","\"0.00001000\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar1;
  msg_25.m_begin = pvVar2;
  file_25.m_end = (iterator)0x101;
  file_25.m_begin = (iterator)&local_5e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5f8,
             msg_25);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_600 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),100);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_608,0x101,1,2,pvVar1,"ValueFromAmount(COIN/1000000).write()",
             "0.00000100","\"0.00000100\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pvVar1;
  msg_26.m_begin = pvVar2;
  file_26.m_end = (iterator)0x102;
  file_26.m_begin = (iterator)&local_618;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_628,
             msg_26);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_630 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),10);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_638,0x102,1,2,pvVar1,"ValueFromAmount(COIN/10000000).write()",
             "0.00000010","\"0.00000010\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pvVar1;
  msg_27.m_begin = pvVar2;
  file_27.m_end = (iterator)0x103;
  file_27.m_begin = (iterator)&local_648;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_658,
             msg_27);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_660 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),1);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_58,&local_668,0x103,1,2,pvVar1,"ValueFromAmount(COIN/100000000).write()",
             "0.00000001","\"0.00000001\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar1;
  msg_28.m_begin = pvVar2;
  file_28.m_end = (iterator)0x105;
  file_28.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_688,
             msg_28);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_690 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),0x7fffffffffffffff);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (local_58,&local_698,0x105,1,2,pvVar1,
             "ValueFromAmount(std::numeric_limits<CAmount>::max()).write()","92233720368.54775807",
             "\"92233720368.54775807\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar1;
  msg_29.m_begin = pvVar2;
  file_29.m_end = (iterator)0x106;
  file_29.m_begin = (iterator)&local_6a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_6b8,
             msg_29);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_6c0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),0x7ffffffffffffffe);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (local_58,&local_6c8,0x106,1,2,pvVar1,
             "ValueFromAmount(std::numeric_limits<CAmount>::max() - 1).write()",
             "92233720368.54775806","\"92233720368.54775806\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pvVar1;
  msg_30.m_begin = pvVar2;
  file_30.m_end = (iterator)0x107;
  file_30.m_begin = (iterator)&local_6d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6e8,
             msg_30);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_6f0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),0x7ffffffffffffffd);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (local_58,&local_6f8,0x107,1,2,pvVar1,
             "ValueFromAmount(std::numeric_limits<CAmount>::max() - 2).write()",
             "92233720368.54775805","\"92233720368.54775805\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar1;
  msg_31.m_begin = pvVar2;
  file_31.m_end = (iterator)0x108;
  file_31.m_begin = (iterator)&local_708;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_718,
             msg_31);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_720 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),0x7ffffffffffffffc);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (local_58,&local_728,0x108,1,2,pvVar1,
             "ValueFromAmount(std::numeric_limits<CAmount>::max() - 3).write()",
             "92233720368.54775804","\"92233720368.54775804\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar1;
  msg_32.m_begin = pvVar2;
  file_32.m_end = (iterator)0x10a;
  file_32.m_begin = (iterator)&local_738;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_748,
             msg_32);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_750 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),-0x7ffffffffffffffd);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
            (local_58,&local_758,0x10a,1,2,pvVar1,
             "ValueFromAmount(std::numeric_limits<CAmount>::min() + 3).write()",
             "-92233720368.54775805","\"-92233720368.54775805\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar1;
  msg_33.m_begin = pvVar2;
  file_33.m_end = (iterator)0x10b;
  file_33.m_begin = (iterator)&local_768;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_778,
             msg_33);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_780 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),-0x7ffffffffffffffe);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
            (local_58,&local_788,0x10b,1,2,pvVar1,
             "ValueFromAmount(std::numeric_limits<CAmount>::min() + 2).write()",
             "-92233720368.54775806","\"-92233720368.54775806\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pvVar1;
  msg_34.m_begin = pvVar2;
  file_34.m_end = (iterator)0x10c;
  file_34.m_begin = (iterator)&local_798;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_7a8,
             msg_34);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_7b0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),-0x7fffffffffffffff);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  pvVar2 = (iterator)0x2;
  pvVar1 = local_d0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
            (local_58,&local_7b8,0x10c,1,2,pvVar1,
             "ValueFromAmount(std::numeric_limits<CAmount>::min() + 1).write()",
             "-92233720368.54775807","\"-92233720368.54775807\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pvVar1;
  msg_35.m_begin = pvVar2;
  file_35.m_end = (iterator)0x10d;
  file_35.m_begin = (iterator)&local_7c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_7d8,
             msg_35);
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_7e0 = "";
  ValueFromAmount((UniValue *)(local_b8 + 8),-0x8000000000000000);
  UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_b8 + 8,(void *)0x0,0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
            (local_58,&local_7e8,0x10d,1,2,local_d0,
             "ValueFromAmount(std::numeric_limits<CAmount>::min()).write()","-92233720368.54775808",
             "\"-92233720368.54775808\"");
  std::__cxx11::string::~string((string *)local_d0);
  UniValue::~UniValue((UniValue *)(local_b8 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_40._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_format_monetary_values)
{
    BOOST_CHECK(ValueFromAmount(0LL).write() == "0.00000000");
    BOOST_CHECK(ValueFromAmount(1LL).write() == "0.00000001");
    BOOST_CHECK(ValueFromAmount(17622195LL).write() == "0.17622195");
    BOOST_CHECK(ValueFromAmount(50000000LL).write() == "0.50000000");
    BOOST_CHECK(ValueFromAmount(89898989LL).write() == "0.89898989");
    BOOST_CHECK(ValueFromAmount(100000000LL).write() == "1.00000000");
    BOOST_CHECK(ValueFromAmount(2099999999999990LL).write() == "20999999.99999990");
    BOOST_CHECK(ValueFromAmount(2099999999999999LL).write() == "20999999.99999999");

    BOOST_CHECK_EQUAL(ValueFromAmount(0).write(), "0.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount((COIN/10000)*123456789).write(), "12345.67890000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN).write(), "-1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN/10).write(), "-0.10000000");

    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000000).write(), "100000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000000).write(), "10000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000000).write(), "1000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000).write(), "100000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000).write(), "10000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000).write(), "1000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100).write(), "100.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10).write(), "10.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN).write(), "1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10).write(), "0.10000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100).write(), "0.01000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000).write(), "0.00100000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000).write(), "0.00010000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000).write(), "0.00001000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000000).write(), "0.00000100");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000000).write(), "0.00000010");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000000).write(), "0.00000001");

    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max()).write(), "92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 1).write(), "92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 2).write(), "92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 3).write(), "92233720368.54775804");
    // ...
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 3).write(), "-92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 2).write(), "-92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 1).write(), "-92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min()).write(), "-92233720368.54775808");
}